

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_decompress.c
# Opt level: O3

int infile_format(char *fname)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  int iVar3;
  int iVar4;
  uchar buf [12];
  long local_30;
  int local_28;
  
  __stream = fopen(fname,"rb");
  if (__stream == (FILE *)0x0) {
    iVar3 = -2;
  }
  else {
    local_28 = 0;
    local_30 = 0;
    sVar2 = fread(&local_30,1,0xc,__stream);
    fclose(__stream);
    iVar3 = -1;
    if (sVar2 == 0xc) {
      iVar1 = get_file_format(fname);
      iVar3 = 2;
      if (iVar1 != 2) {
        iVar4 = 1;
        if ((local_28 != 0xa870a0d || local_30 != 0x2020506a0c000000) &&
           ((int)local_30 != 0xa870a0d)) {
          if ((int)local_30 != 0x51ff4fff) {
            return -1;
          }
          iVar4 = 0;
        }
        iVar3 = iVar1;
        if (iVar4 != iVar1) {
          infile_format_cold_1();
          iVar3 = iVar4;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int infile_format(const char *fname)
{
    FILE *reader;
    const char *s, *magic_s;
    int ext_format, magic_format;
    unsigned char buf[12];
    OPJ_SIZE_T l_nb_read;

    reader = fopen(fname, "rb");

    if (reader == NULL) {
        return -2;
    }

    memset(buf, 0, 12);
    l_nb_read = fread(buf, 1, 12, reader);
    fclose(reader);
    if (l_nb_read != 12) {
        return -1;
    }



    ext_format = get_file_format(fname);

    if (ext_format == JPT_CFMT) {
        return JPT_CFMT;
    }

    if (memcmp(buf, JP2_RFC3745_MAGIC, 12) == 0 || memcmp(buf, JP2_MAGIC, 4) == 0) {
        magic_format = JP2_CFMT;
        magic_s = ".jp2 or .jph";
    } else if (memcmp(buf, J2K_CODESTREAM_MAGIC, 4) == 0) {
        magic_format = J2K_CFMT;
        magic_s = ".j2k or .jpc or .j2c or .jhc";
    } else {
        return -1;
    }

    if (magic_format == ext_format) {
        return ext_format;
    }

    s = fname + strlen(fname) - 4;

    fputs("\n===========================================\n", stderr);
    fprintf(stderr, "The extension of this file is incorrect.\n"
            "FOUND %s. SHOULD BE %s\n", s, magic_s);
    fputs("===========================================\n", stderr);

    return magic_format;
}